

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int balance(BtCursor *pCur)

{
  Pgno *pPVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  ushort uVar6;
  BtCursor *pBVar7;
  BtShared *pBVar8;
  PgHdr *pPVar9;
  uint uVar10;
  Pgno PVar11;
  DbPage *pDVar12;
  i64 iVar13;
  char cVar14;
  u16 uVar15;
  u16 uVar16;
  ushort uVar17;
  int iVar18;
  u32 uVar19;
  int iVar20;
  BtCursor **ppBVar21;
  MemPage *pMVar22;
  undefined1 *puVar23;
  long lVar24;
  MemPage *pMVar25;
  MemPage **ppMVar26;
  uint uVar27;
  MemPage *pMVar28;
  MemPage **ppMVar29;
  ulong uVar30;
  Pgno PVar31;
  MemPage *pPage;
  size_t __n;
  uint uVar32;
  ulong uVar33;
  MemPage **ppMVar34;
  u16 *puVar35;
  MemPage *pMVar36;
  uint uVar37;
  u8 *puVar38;
  int iVar39;
  uint uVar40;
  u16 *puVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  int iVar45;
  u8 *puVar46;
  long lVar47;
  MemPage *pMVar48;
  bool bVar49;
  int local_288;
  char local_281;
  BtCursor *local_280;
  ulong local_278;
  MemPage *local_270;
  MemPage *local_268;
  MemPage *local_260;
  ulong local_258;
  MemPage *local_250;
  u16 *local_248;
  MemPage *local_240;
  MemPage *local_238;
  u16 *local_230;
  MemPage *local_228;
  BtShared *local_220;
  MemPage *local_218;
  MemPage *local_210;
  u16 *local_208;
  undefined8 local_200;
  Pgno pgnoNew;
  Pgno local_1f4 [7];
  MemPage *apOld [3];
  int szNew [5];
  u8 abDone [5];
  char local_190;
  Pgno local_184;
  uint *local_180;
  MemPage *local_178;
  DbPage *local_170;
  DbPage *local_168;
  CellInfo local_160;
  MemPage *pNew;
  MemPage *local_140 [4];
  ulong local_120;
  uint local_114;
  uint local_110;
  uint local_10c;
  MemPage *pChild;
  MemPage *pMStack_100;
  MemPage *local_f8;
  u16 *puStack_f0;
  MemPage **local_e8;
  u8 *puStack_e0;
  u8 *local_d8;
  u8 *puStack_d0;
  u8 *local_c8;
  u8 *puStack_c0;
  Pgno local_b8 [7];
  int iStack_9c;
  u16 szCell;
  long lStack_80;
  u8 *apDiv [2];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  
  local_168 = (DbPage *)0x0;
  pPage = pCur->pPage;
  local_280 = pCur;
LAB_00173b9c:
  if ((pPage->nFree < 0) && (iVar18 = btreeComputeFreeSpace(pPage), iVar18 != 0)) {
    iVar18 = 0;
  }
  else if (pPage->nOverflow == '\0') {
    iVar18 = 0;
    if (((int)(pCur->pBt->usableSize * 2) < pPage->nFree * 3) &&
       (cVar14 = pCur->iPage, iVar18 = 0, cVar14 != '\0')) {
LAB_00173c1b:
      if (pPage->pDbPage->nRef < 2) {
        pMVar22 = pCur->apPage[(long)cVar14 + -1];
        uVar17 = pCur->aiIdx[(long)cVar14 + -1];
        iVar18 = sqlite3PagerWrite(pMVar22->pDbPage);
        if ((iVar18 == 0) &&
           ((local_281 = cVar14, local_240 = (MemPage *)(ulong)uVar17, -1 < pMVar22->nFree ||
            (iVar18 = btreeComputeFreeSpace(pMVar22), iVar18 == 0)))) {
          local_250 = pMVar22;
          if ((pPage->intKeyLeaf != '\0') &&
             ((((pPage->nOverflow == '\x01' && (pPage->aiOvfl[0] == pPage->nCell)) &&
               (pMVar22->pgno != 1)) && (pMVar22->nCell == (u16)local_240)))) {
            if (pPage->aiOvfl[0] == 0) {
              iVar18 = sqlite3CorruptError(0x127bb);
            }
            else {
              pBVar8 = pPage->pBt;
              iVar18 = allocateBtreePage(pBVar8,&pNew,&pgnoNew,0,'\0');
              if (iVar18 == 0) {
                apOld[0] = (MemPage *)pPage->apOvfl[0];
                szCell = (*pPage->xCellSize)(pPage,(u8 *)apOld[0]);
                pMVar22 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
                zeroPage(pMVar22,0xd);
                pChild = (MemPage *)CONCAT44(pChild._4_4_,1);
                local_f8 = (MemPage *)apOld;
                puStack_f0 = &szCell;
                local_e8 = (MemPage **)pPage->aDataEnd;
                local_b8[0] = 2;
                pMStack_100 = pPage;
                iVar18 = rebuildPage((CellArray *)&pChild,0,1,pMVar22);
                local_160.nKey = CONCAT44(local_160.nKey._4_4_,iVar18);
                if (iVar18 == 0) {
                  pMVar22->nFree =
                       (pBVar8->usableSize - ((uint)szCell + (uint)pMVar22->cellOffset)) + -2;
                  if ((pBVar8->autoVacuum != '\0') &&
                     (ptrmapPut(pBVar8,pgnoNew,'\x05',local_250->pgno,(int *)&local_160),
                     pMVar22->minLocal < szCell)) {
                    ptrmapPutOvflPtr(pMVar22,pMVar22,&apOld[0]->isInit,(int *)&local_160);
                  }
                  uVar42 = (ulong)(CONCAT11(pPage->aCellIdx[(ulong)pPage->nCell * 2 + -2],
                                            pPage->aCellIdx[(ulong)pPage->nCell * 2 + -1]) &
                                  pPage->maskPage);
                  uVar33 = 0;
                  puVar46 = pPage->aData + uVar42;
                  pMVar25 = (MemPage *)(pPage->aData + uVar42 + 2);
                  do {
                    pMVar28 = pMVar25;
                    puVar38 = puVar46;
                    if (7 < uVar33) break;
                    uVar33 = uVar33 + 1;
                    puVar46 = puVar38 + 1;
                    pMVar25 = (MemPage *)&pMVar28->intKey;
                  } while ((char)*puVar38 < '\0');
                  lVar24 = 4;
                  do {
                    apOld[0] = pMVar28;
                    uVar4 = *(u8 *)((long)&apOld[0][-1].xParseCell + 7);
                    aBalanceQuickSpace[lVar24] = uVar4;
                    lVar24 = lVar24 + 1;
                    if (-1 < (char)uVar4) break;
                    pMVar28 = (MemPage *)&apOld[0]->intKey;
                  } while (apOld[0] < (MemPage *)(puVar38 + 10));
                  if ((int)local_160.nKey == 0) {
                    insertCell(local_250,(uint)local_250->nCell,aBalanceQuickSpace,(int)lVar24,
                               (u8 *)0x0,pPage->pgno,(int *)&local_160);
                  }
                  *(Pgno *)(local_250->aData + (ulong)local_250->hdrOffset + 8) =
                       pgnoNew >> 0x18 | (pgnoNew & 0xff0000) >> 8 | (pgnoNew & 0xff00) << 8 |
                       pgnoNew << 0x18;
                  iVar18 = (int)local_160.nKey;
                }
                releasePage(pMVar22);
              }
            }
            goto LAB_001748ea;
          }
          local_170 = (DbPage *)pcache1Alloc(pCur->pBt->pageSize);
          pMVar22 = local_250;
          local_288 = 0;
          abDone[0] = '\0';
          abDone[1] = '\0';
          abDone[2] = '\0';
          abDone[3] = '\0';
          abDone[4] = '\0';
          pChild = (MemPage *)0x0;
          pMStack_100 = (MemPage *)0x0;
          local_f8 = (MemPage *)0x0;
          puStack_f0 = (u16 *)0x0;
          local_e8 = (MemPage **)0x0;
          puStack_e0 = (u8 *)0x0;
          local_d8 = (u8 *)0x0;
          puStack_d0 = (u8 *)0x0;
          local_b8[4] = 0;
          local_b8[5] = 0;
          local_c8 = (u8 *)0x0;
          puStack_c0 = (u8 *)0x0;
          local_b8[0] = 0;
          local_b8[1] = 0;
          local_b8[2] = 0;
          local_b8[3] = 0;
          iVar18 = 7;
          if (local_170 != (DbPage *)0x0) {
            uVar32 = pCur->hints & 1;
            uVar44 = (uint)local_250->nCell + (uint)local_250->nOverflow;
            local_258 = 0;
            if (1 < uVar44) {
              uVar27 = (uint)local_240;
              if (uVar27 == 0) {
                local_258 = 0;
              }
              else {
                if (uVar44 == uVar27) {
                  uVar27 = (uVar27 + uVar32) - 2;
                }
                else {
                  uVar27 = uVar27 - 1;
                }
                local_258 = (ulong)uVar27;
              }
              uVar44 = 2 - uVar32;
            }
            pMVar25 = (MemPage *)(ulong)uVar44;
            uVar27 = ((int)local_258 - (uint)local_250->nOverflow) + uVar44;
            if (uVar27 == local_250->nCell) {
              uVar42 = (ulong)local_250->hdrOffset + 8;
            }
            else {
              uVar42 = (ulong)(CONCAT11(local_250->aCellIdx[(long)(int)uVar27 * 2],
                                        local_250->aCellIdx[(long)(int)uVar27 * 2 + 1]) &
                              local_250->maskPage);
            }
            local_180 = (uint *)(local_250->aData + uVar42);
            local_220 = local_250->pBt;
            local_238 = (MemPage *)CONCAT44(local_238._4_4_,uVar44 + 1);
            uVar19 = sqlite3Get4byte((u8 *)local_180);
            local_228 = (MemPage *)CONCAT44(local_228._4_4_,uVar19);
            __n = (size_t)(uVar44 * 8);
            uVar27 = (int)local_258 + -1 + uVar44;
            local_268 = (MemPage *)(szNew + (long)((long)&pMVar25[-1].xParseCell + 7));
            iVar18 = 0;
            iVar39 = 0;
            local_270 = pMVar25;
            local_178 = pMVar25;
            while (pMVar25 = (MemPage *)((ulong)local_238 & 0xffffffff), iVar18 == 0) {
              local_288 = getAndInitPage(local_220,(Pgno)local_228,(MemPage **)((long)apOld + __n),
                                         (BtCursor *)0x0,0);
              if (local_288 != 0) break;
              pMVar28 = *(MemPage **)((long)apOld + __n);
              if ((pMVar28->nFree < 0) &&
                 (local_288 = btreeComputeFreeSpace(pMVar28), local_288 != 0)) goto LAB_001741fd;
              iVar18 = iVar39 + (uint)pMVar28->nCell;
              iVar39 = iVar18 + 4;
              if (__n == 0) {
                local_184 = (Pgno)local_228;
                uVar40 = iVar18 + 7;
                uVar27 = uVar40 & 0x7ffffffc;
                pMVar22 = (MemPage *)sqlite3Malloc((long)(int)(uVar27 * 10 + local_220->pageSize));
                local_f8 = pMVar22;
                if (pMVar22 == (MemPage *)0x0) {
                  local_288 = 7;
                  pCur = local_280;
                  goto LAB_00174837;
                }
                local_230 = pMVar22->aiOvfl + (ulong)uVar27 * 4 + -0xe;
                puStack_f0 = local_230;
                local_208 = local_230 + uVar27;
                pMStack_100 = apOld[0];
                bVar2 = apOld[0]->leaf;
                local_248 = (u16 *)((ulong)bVar2 << 2);
                local_210 = apOld[0];
                local_278 = (ulong)apOld[0]->intKeyLeaf;
                pMVar28 = (MemPage *)0x0;
                uVar42 = 0;
                local_218 = (MemPage *)0x0;
                local_270 = pMVar25;
                goto LAB_001742f3;
              }
              local_270 = (MemPage *)((long)&local_270[-1].xParseCell + 7);
              local_278 = CONCAT44(local_278._4_4_,uVar27);
              if (pMVar22->nOverflow == 0) {
LAB_00174121:
                lVar24 = (long)(int)(uVar27 - pMVar22->nOverflow);
                puVar46 = pMVar22->aData +
                          (CONCAT11(pMVar22->aCellIdx[lVar24 * 2],pMVar22->aCellIdx[lVar24 * 2 + 1])
                          & pMVar22->maskPage);
                *(u8 **)((long)&lStack_80 + __n) = puVar46;
                uVar19 = sqlite3Get4byte(puVar46);
                local_228 = (MemPage *)CONCAT44(local_228._4_4_,uVar19);
                uVar15 = (*pMVar22->xCellSize)(pMVar22,puVar46);
                uVar40 = (uint)uVar15;
                local_268->isInit = (char)uVar40;
                pDVar12 = local_170;
                local_268->intKey = (char)(uVar40 >> 8);
                local_268->intKeyLeaf = (char)(uVar40 >> 0x10);
                local_268->field_0x3 = (char)(uVar40 >> 0x18);
                if (((local_220->btsFlags & 0xc) != 0) &&
                   (iVar18 = (int)puVar46 - *(int *)&pMVar22->aData,
                   (int)(iVar18 + (uint)uVar15) <= (int)local_220->usableSize)) {
                  memcpy((u8 *)((long)&local_170->pPage + (long)iVar18),puVar46,(ulong)uVar40);
                  *(u8 **)((long)&lStack_80 + __n) =
                       (u8 *)(((long)puVar46 - (long)local_250->aData) + (long)pDVar12);
                  pMVar22 = local_250;
                }
                dropCell(pMVar22,uVar27 - pMVar22->nOverflow,(uint)uVar15,&local_288);
                iVar18 = local_288;
                uVar27 = (uint)local_278;
              }
              else {
                if (uVar27 != pMVar22->aiOvfl[0]) {
                  uVar27 = (int)local_258 + (int)local_270;
                  goto LAB_00174121;
                }
                puVar46 = pMVar22->apOvfl[0];
                *(u8 **)((long)&lStack_80 + __n) = puVar46;
                uVar19 = sqlite3Get4byte(puVar46);
                local_228 = (MemPage *)CONCAT44(local_228._4_4_,uVar19);
                uVar15 = (*pMVar22->xCellSize)(pMVar22,puVar46);
                uVar40 = (uint)uVar15;
                local_268->isInit = (char)uVar40;
                local_268->intKey = (char)(uVar40 >> 8);
                local_268->intKeyLeaf = (char)(uVar40 >> 0x10);
                local_268->field_0x3 = (char)(uVar40 >> 0x18);
                pMVar22->nOverflow = '\0';
                iVar18 = 0;
              }
              __n = __n - 8;
              uVar27 = uVar27 - 1;
              local_268 = (MemPage *)((long)&local_268[-1].xParseCell + 4);
            }
            __n = __n + 8;
LAB_001741fd:
            memset(apOld,0,__n);
            pCur = local_280;
            uVar27 = 0;
            iVar18 = local_288;
            goto LAB_0017486f;
          }
          goto LAB_001748c8;
        }
        goto LAB_001748ea;
      }
      iVar18 = 0x12c33;
LAB_001757f2:
      iVar18 = sqlite3CorruptError(iVar18);
    }
  }
  else {
    cVar14 = pCur->iPage;
    if (cVar14 != '\0') goto LAB_00173c1b;
    ppBVar21 = &pCur->pBt->pCursor;
    while (pBVar7 = *ppBVar21, pBVar7 != (BtCursor *)0x0) {
      if (((pBVar7 != pCur) && (pBVar7->eState == '\0')) && (pBVar7->pPage == pCur->pPage)) {
        iVar18 = 0x12bf7;
        goto LAB_001757f2;
      }
      ppBVar21 = &pBVar7->pNext;
    }
    pChild = (MemPage *)0x0;
    apOld[0] = (MemPage *)((ulong)apOld[0] & 0xffffffff00000000);
    pBVar8 = pPage->pBt;
    iVar18 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar18 == 0) {
      pNew._0_4_ = allocateBtreePage(pBVar8,&pChild,(Pgno *)apOld,pPage->pgno,'\0');
      pMVar22 = pChild;
      copyNodeContent(pPage,pChild,(int *)&pNew);
      if (pBVar8->autoVacuum != '\0') {
        ptrmapPut(pBVar8,(Pgno)apOld[0],'\x05',pPage->pgno,(int *)&pNew);
      }
      iVar18 = (int)pNew;
      if ((int)pNew != 0) goto LAB_00175827;
      memcpy(pMVar22->aiOvfl,pPage->aiOvfl,(ulong)((uint)pPage->nOverflow * 2));
      memcpy(pMVar22->apOvfl,pPage->apOvfl,(ulong)pPage->nOverflow << 3);
      pMVar22->nOverflow = pPage->nOverflow;
      zeroPage(pPage,*pMVar22->aData & 0xfffffff7);
      *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
           (Pgno)apOld[0] >> 0x18 | ((Pgno)apOld[0] & 0xff0000) >> 8 |
           ((Pgno)apOld[0] & 0xff00) << 8 | (Pgno)apOld[0] << 0x18;
      local_280->apPage[1] = pMVar22;
      local_280->iPage = '\x01';
      local_280->ix = 0;
      local_280->aiIdx[0] = 0;
      local_280->apPage[0] = pPage;
      iVar18 = 0;
      pCur = local_280;
      goto LAB_0017490c;
    }
    pMVar22 = (MemPage *)0x0;
LAB_00175827:
    local_280->apPage[1] = (MemPage *)0x0;
    releasePage(pMVar22);
  }
  goto LAB_001757f9;
LAB_001742f3:
  local_200 = (ulong)local_248 & 0xffff;
  if (pMVar28 == local_270) goto LAB_00174595;
  pMVar25 = apOld[(long)pMVar28];
  puVar46 = pMVar25->aData;
  if (*puVar46 != *local_210->aData) {
    iVar18 = 0x12960;
    pCur = local_280;
    goto LAB_0017482e;
  }
  local_260 = (MemPage *)(ulong)pMVar25->nCell;
  uVar17 = pMVar25->maskPage;
  puVar38 = puVar46 + pMVar25->cellOffset;
  uVar33 = (ulong)(int)uVar42;
  local_268 = pMVar28;
  local_228 = pMVar25;
  memset(local_230 + uVar33,0,(ulong)(((uint)pMVar25->nCell + (uint)pMVar25->nOverflow) * 2));
  bVar3 = local_228->nOverflow;
  if ((ulong)bVar3 != 0) {
    uVar27 = (uint)local_228->aiOvfl[0];
    if ((ushort)local_260 < local_228->aiOvfl[0]) {
      iVar18 = sqlite3CorruptError(0x12978);
      pMVar25 = local_270;
      pCur = local_280;
      uVar27 = 0;
      goto LAB_0017486f;
    }
    lVar24 = uVar33 << 0x20;
    puVar35 = pMVar22->aiOvfl + uVar33 * 4 + -0xe;
    while (bVar49 = uVar27 != 0, uVar27 = uVar27 - 1, bVar49) {
      *(u8 **)(pMVar22->aiOvfl + uVar33 * 4 + -0xe) =
           puVar46 + (CONCAT11(*puVar38,puVar38[1]) & uVar17);
      puVar38 = puVar38 + 2;
      uVar33 = uVar33 + 1;
      lVar24 = lVar24 + 0x100000000;
      uVar42 = (ulong)((int)uVar42 + 1);
      puVar35 = puVar35 + 4;
    }
    for (uVar33 = 0; bVar3 != uVar33; uVar33 = uVar33 + 1) {
      *(u8 **)puVar35 = local_228->apOvfl[uVar33];
      lVar24 = lVar24 + 0x100000000;
      uVar42 = (ulong)((int)uVar42 + 1);
      puVar35 = puVar35 + 4;
    }
    pChild = (MemPage *)CONCAT44(pChild._4_4_,(int)uVar42);
    uVar33 = lVar24 >> 0x20;
  }
  uVar5 = local_228->cellOffset;
  uVar6 = local_228->nCell;
  lVar24 = uVar33 << 0x20;
  for (; puVar38 < puVar46 + (ulong)uVar6 * 2 + (ulong)uVar5; puVar38 = puVar38 + 2) {
    *(u8 **)(pMVar22->aiOvfl + uVar33 * 4 + -0xe) =
         puVar46 + (uVar17 & CONCAT11(*puVar38,puVar38[1]));
    uVar33 = uVar33 + 1;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,(int)uVar33);
    lVar24 = lVar24 + 0x100000000;
  }
  *(int *)(&szCell + (long)local_268 * 2) = (int)uVar33;
  if ((local_268 < local_178) && ((char)local_278 == '\0')) {
    uVar27 = szNew[(long)local_268] & 0xffff;
    lVar47 = lVar24 >> 0x1f;
    *(short *)((long)local_230 + lVar47) = (short)szNew[(long)local_268];
    puVar46 = (u8 *)((long)local_208 + (long)(int)local_218);
    uVar37 = (int)local_218 + uVar27;
    pMVar25 = (MemPage *)(ulong)uVar37;
    memcpy(puVar46,apDiv[(long)local_268],(ulong)uVar27);
    puVar46 = puVar46 + (long)local_248;
    *(u8 **)((long)pMVar22->aiOvfl + (lVar24 >> 0x1d) + -0x1c) = puVar46;
    local_200._0_4_ = (uint)*(ushort *)((long)local_230 + lVar47) - (int)local_200;
    *(short *)((long)local_230 + lVar47) = (short)(int)local_200;
    if (local_228->leaf == '\0') {
      *(undefined4 *)puVar46 = *(undefined4 *)(local_228->aData + 8);
    }
    else {
      puVar23 = (undefined1 *)
                ((long)(pMVar22->aiOvfl + (ulong)(uVar40 >> 2 & 0x1fffffff) * 0x14 + -0xe) +
                (long)(int)uVar37);
      while ((ushort)(int)local_200 < 4) {
        *puVar23 = 0;
        local_200._0_4_ = local_230[lVar24 >> 0x20] + 1;
        local_230[lVar24 >> 0x20] = (u16)(int)local_200;
        pMVar25 = (MemPage *)(ulong)((int)pMVar25 + 1);
        puVar23 = puVar23 + 1;
      }
    }
    uVar27 = (int)uVar33 + 1;
    uVar33 = (ulong)uVar27;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,uVar27);
    local_218 = pMVar25;
  }
  pMVar28 = (MemPage *)&local_268->intKey;
  uVar42 = uVar33 & 0xffffffff;
  goto LAB_001742f3;
LAB_00174595:
  local_228 = (MemPage *)
              CONCAT44(local_228._4_4_,local_220->usableSize + (uint)(ushort)local_248 + -0xc);
  iVar18 = 0;
  for (pMVar22 = (MemPage *)0x0; pMVar22 != local_270; pMVar22 = (MemPage *)&pMVar22->intKey) {
    pMVar25 = apOld[(long)pMVar22];
    (&local_e8)[iVar18] = (MemPage **)pMVar25->aDataEnd;
    PVar31 = *(Pgno *)(&szCell + (long)pMVar22 * 2);
    local_b8[iVar18] = PVar31;
    if (iVar18 == 0) {
      iVar39 = 0;
    }
    else {
      iVar39 = iVar18 + -1;
      if (PVar31 != local_b8[(long)iVar18 + -1]) {
        iVar39 = iVar18;
      }
    }
    iVar18 = iVar39;
    if ((uint)local_278 == 0) {
      iVar18 = iVar39 + 1;
      (&local_e8)[(long)iVar39 + 1] = (MemPage **)local_250->aDataEnd;
      local_b8[(long)iVar39 + 1] = PVar31 + 1;
    }
    iVar39 = (Pgno)local_228 - pMVar25->nFree;
    szNew[(long)pMVar22] = iVar39;
    for (uVar42 = 0; uVar42 < pMVar25->nOverflow; uVar42 = uVar42 + 1) {
      uVar15 = (*pMVar25->xCellSize)(pMVar25,pMVar25->apOvfl[uVar42]);
      iVar39 = iVar39 + (uint)uVar15 + 2;
      szNew[(long)pMVar22] = iVar39;
    }
    local_1f4[(long)((long)&pMVar22[-1].xParseCell + 7)] = PVar31;
    iVar18 = iVar18 + 1;
  }
  local_268 = (MemPage *)CONCAT44(local_268._4_4_,pChild._0_4_);
  puVar35 = (u16 *)((ulong)local_238 & 0xffffffff);
  puVar41 = (u16 *)0x0;
  pCur = local_280;
LAB_00174694:
  do {
    if ((long)(int)puVar35 <= (long)puVar41) {
      pMVar28 = (MemPage *)(ulong)((int)puVar35 - 1);
      local_248 = puStack_f0;
      local_260 = (MemPage *)((long)puStack_f0 - (ulong)(uint)((int)local_278 * 2));
      pMVar22 = pMVar28;
      local_208 = puVar35;
      break;
    }
    iVar18 = szNew[(long)puVar41];
    local_248 = (u16 *)((long)puVar41 + 1);
    local_260 = (MemPage *)CONCAT44(local_260._4_4_,(int)puVar41 + 2);
    for (; (int)(Pgno)local_228 < iVar18; iVar18 = iVar18 - (uVar15 + 2)) {
      if ((int)puVar35 <= (int)local_248) {
        if ((u16 *)0x3 < puVar41) {
          szNew[(long)puVar41] = iVar18;
          iVar18 = sqlite3CorruptError(0x129dd);
          pMVar25 = local_270;
          uVar27 = 0;
          goto LAB_0017486f;
        }
        szNew[(long)((long)puVar41 + 1)] = 0;
        local_1f4[(long)puVar41] = (Pgno)local_268;
        puVar35 = (u16 *)((ulong)local_260 & 0xffffffff);
      }
      PVar31 = local_1f4[(long)((long)puVar41 + -1)];
      uVar15 = cachedCellSize((CellArray *)&pChild,PVar31 - 1);
      iVar39 = uVar15 + 2;
      if ((uint)local_278 == 0) {
        iVar39 = 0;
        if ((int)PVar31 < (int)(Pgno)local_268) {
          uVar16 = cachedCellSize((CellArray *)&pChild,PVar31);
          iVar39 = uVar16 + 2;
        }
      }
      szNew[(long)((long)puVar41 + 1)] = szNew[(long)((long)puVar41 + 1)] + iVar39;
      local_1f4[(long)((long)puVar41 + -1)] = PVar31 - 1;
      pCur = local_280;
    }
    szNew[(long)puVar41] = iVar18;
    PVar31 = local_1f4[(long)((long)puVar41 + -1)];
    while ((int)PVar31 < (int)(Pgno)local_268) {
      uVar17 = cachedCellSize((CellArray *)&pChild,PVar31);
      iVar18 = iVar18 + (uint)uVar17 + 2;
      if ((int)(Pgno)local_228 < iVar18) {
        local_1f4[(long)((long)puVar41 + -1)] = PVar31;
        if (puVar41 == (u16 *)0x0) {
          iVar18 = 0;
        }
        else {
          iVar18 = *(int *)((long)&local_200 + (long)puVar41 * 4 + 4);
        }
        puVar41 = local_248;
        if (iVar18 < (int)PVar31) goto LAB_00174694;
        iVar18 = 0x129fe;
        goto LAB_0017482e;
      }
      PVar31 = PVar31 + 1;
      szNew[(long)puVar41] = iVar18;
      if ((uint)local_278 == 0) {
        iVar39 = 0;
        if ((int)PVar31 < (int)(Pgno)local_268) {
          uVar17 = cachedCellSize((CellArray *)&pChild,PVar31);
          goto LAB_001747bc;
        }
      }
      else {
LAB_001747bc:
        iVar39 = uVar17 + 2;
      }
      szNew[(long)((long)puVar41 + 1)] = szNew[(long)((long)puVar41 + 1)] - iVar39;
    }
    local_1f4[(long)((long)puVar41 + -1)] = PVar31;
    puVar35 = local_248;
    puVar41 = local_248;
  } while( true );
  do {
    pMVar25 = local_270;
    local_190 = (char)uVar32;
    if ((int)pMVar22 < 1) {
      local_218 = (MemPage *)CONCAT44(local_218._4_4_,(uint)*local_210->aData);
      local_240 = (MemPage *)(ulong)(uint)((int)local_240 - (int)local_258);
      pMVar28 = (MemPage *)0x0;
      pMVar22 = (MemPage *)((ulong)local_208 & 0xffffffff);
      if ((int)local_208 < 1) {
        pMVar22 = pMVar28;
      }
      uVar32 = 0;
      goto LAB_00174c33;
    }
    iVar18 = szNew[(long)((long)&pMVar22[-1].xParseCell + 7)];
    iVar39 = szNew[(long)pMVar22];
    pMVar25 = (MemPage *)((long)&pMVar22[-1].xParseCell + 7);
    iVar20 = *(int *)((long)&local_200 + (long)pMVar22 * 4 + 4);
    uVar42 = (ulong)iVar20;
    cachedCellSize((CellArray *)&pChild,iVar20 - (uint)local_278);
    local_230 = (u16 *)(ulong)((uint)(pMVar22 == pMVar28) * 2 - 2);
    lVar24 = uVar42 + 1;
    local_218 = pMVar22;
    do {
      uVar27 = (uint)uVar42;
      uVar40 = uVar27 - 1;
      cachedCellSize((CellArray *)&pChild,uVar40);
      if (iVar39 == 0) {
        uVar17 = local_248[lVar24 + -2];
        iVar20 = local_260->aiOvfl[lVar24 + -0xf] + 2;
      }
      else {
        if (local_190 != '\0') break;
        iVar20 = (uint)local_260->aiOvfl[lVar24 + -0xf] + iVar39 + 2;
        uVar17 = local_248[lVar24 + -2];
        if ((int)(((int)local_230 + iVar18) - (uint)uVar17) < iVar20) break;
      }
      iVar18 = (iVar18 - (uint)uVar17) + -2;
      local_1f4[(long)((long)&pMVar25[-1].xParseCell + 7)] = uVar40;
      lVar24 = lVar24 + -1;
      uVar42 = (ulong)uVar40;
      iVar39 = iVar20;
      uVar27 = uVar40;
    } while (1 < lVar24);
    szNew[(long)local_218] = iVar39;
    szNew[(long)pMVar25] = iVar18;
    PVar31 = 0;
    if (local_218 != (MemPage *)0x1) {
      PVar31 = local_1f4[(ulong)((int)local_218 - 2) - 1];
    }
    pMVar22 = pMVar25;
  } while ((int)PVar31 < (int)uVar27);
  iVar18 = 0x12a28;
  pCur = local_280;
LAB_0017482e:
  pMVar25 = local_270;
  local_288 = sqlite3CorruptError(iVar18);
LAB_00174837:
  uVar27 = 0;
  iVar18 = local_288;
  goto LAB_0017486f;
LAB_00174c33:
  uVar27 = uVar32;
  if (pMVar22 == pMVar28) goto LAB_00174d4b;
  if (local_178 < pMVar28) {
    PVar31 = 1;
    if (local_190 == '\0') {
      PVar31 = local_184;
    }
    local_288 = allocateBtreePage(local_220,(MemPage **)&local_160,&local_184,PVar31,'\0');
    iVar13 = local_160.nKey;
    pBVar8 = local_220;
    pCur = local_280;
    iVar18 = local_288;
    if (local_288 != 0) goto LAB_0017486f;
    zeroPage((MemPage *)local_160.nKey,(int)local_218);
    local_140[(long)((long)&pMVar28[-1].xParseCell + 7)] = (MemPage *)iVar13;
    *(Pgno *)(&szCell + (long)pMVar28 * 2) = (Pgno)local_268;
    if (pBVar8->autoVacuum != '\0') {
      ptrmapPut(pBVar8,*(Pgno *)(iVar13 + 4),'\x05',local_250->pgno,&local_288);
      goto LAB_00174d2e;
    }
  }
  else {
    pMVar48 = apOld[(long)pMVar28];
    local_140[(long)((long)&pMVar28[-1].xParseCell + 7)] = pMVar48;
    apOld[(long)pMVar28] = (MemPage *)0x0;
    local_288 = sqlite3PagerWrite(pMVar48->pDbPage);
    if (((local_240 == pMVar28) + 1 != (int)pMVar48->pDbPage->nRef) && (local_288 == 0)) {
      iVar18 = 0x12a49;
      uVar32 = uVar32 + 1;
      goto LAB_001756bc;
    }
LAB_00174d2e:
    pCur = local_280;
    uVar27 = uVar32 + 1;
    iVar18 = local_288;
    if (local_288 != 0) goto LAB_0017486f;
  }
  uVar32 = uVar32 + 1;
  pMVar28 = (MemPage *)&pMVar28->intKey;
  goto LAB_00174c33;
LAB_00174d4b:
  uVar42 = 0;
  if (0 < (int)uVar32) {
    uVar42 = (ulong)uVar32;
  }
  for (uVar33 = 0; uVar42 != uVar33; uVar33 = uVar33 + 1) {
    aPgno[uVar33] = local_140[uVar33 - 1]->pgno;
  }
  uVar40 = uVar32 - 1;
  local_208 = (u16 *)CONCAT44(local_208._4_4_,uVar40);
  local_260 = (MemPage *)0x0;
  if (0 < (int)uVar40) {
    local_260 = (MemPage *)(ulong)uVar40;
  }
  local_230 = (u16 *)0x1;
  for (pMVar22 = (MemPage *)0x0; pMVar22 != local_260; pMVar22 = (MemPage *)&pMVar22->intKey) {
    pMVar25 = (MemPage *)((ulong)pMVar22 & 0xffffffff);
    for (uVar33 = (ulong)local_230; (int)uVar33 < (int)uVar32; uVar33 = uVar33 + 1) {
      pMVar28 = (MemPage *)(uVar33 & 0xffffffff);
      if (local_140[(long)(int)pMVar25 + -1]->pgno <= local_140[uVar33 - 1]->pgno) {
        pMVar28 = pMVar25;
      }
      pMVar25 = pMVar28;
    }
    if (pMVar22 != pMVar25) {
      pMVar28 = local_140[(long)((long)&pMVar22[-1].xParseCell + 7)];
      local_210 = (MemPage *)CONCAT44(local_210._4_4_,pMVar28->pgno);
      pMVar25 = local_140[(long)(int)pMVar25 + -1];
      local_240 = (MemPage *)CONCAT44(local_240._4_4_,pMVar25->pgno);
      uVar40 = (uint)sqlite3PendingByte / local_220->pageSize;
      pPVar9 = pMVar28->pDbPage;
      uVar15 = pPVar9->flags;
      uVar16 = pMVar25->pDbPage->flags;
      pPVar9->flags = uVar16;
      sqlite3PcacheMove(pPVar9,uVar40 + 1);
      pPVar9 = pMVar25->pDbPage;
      pPVar9->flags = uVar15;
      PVar11 = (Pgno)local_210;
      sqlite3PcacheMove(pPVar9,(Pgno)local_210);
      pPVar9 = pMVar28->pDbPage;
      pPVar9->flags = uVar16;
      PVar31 = (Pgno)local_240;
      sqlite3PcacheMove(pPVar9,(Pgno)local_240);
      pMVar28->pgno = PVar31;
      pMVar25->pgno = PVar11;
    }
    local_230 = (u16 *)((long)local_230 + 1);
  }
  pMVar22 = local_140[(long)(int)local_208 + -1];
  uVar40 = pMVar22->pgno;
  *local_180 = uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8 | uVar40 << 0x18;
  if ((((ulong)local_218 & 8) == 0) && ((uint)local_238 != uVar32)) {
    ppMVar26 = apOld;
    if ((int)(uint)local_238 < (int)uVar32) {
      ppMVar26 = &pNew;
    }
    *(undefined4 *)(pMVar22->aData + 8) = *(undefined4 *)(ppMVar26[(long)local_178]->aData + 8);
  }
  puVar35 = (u16 *)(long)(int)uVar32;
  local_230 = puVar35;
  if (local_220->autoVacuum != '\0') {
    bVar49 = (uint)local_278 == 0;
    pMVar22 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
    uVar30 = (ulong)((uint)pMVar22->nOverflow + (uint)pMVar22->nCell);
    iVar18 = 0;
    lVar24 = 0;
    local_238 = pMVar22;
    for (uVar33 = 0; (long)uVar33 < (long)(int)(Pgno)local_268; uVar33 = uVar33 + 1) {
      pMVar25 = *(MemPage **)(local_f8->aiOvfl + uVar33 * 4 + -0xe);
      lVar47 = (long)(int)lVar24;
      lVar24 = lVar24 << 0x20;
      ppMVar26 = apOld + lVar47 + 1;
      ppMVar29 = local_140 + lVar47;
      for (; uVar33 == uVar30;
          uVar30 = (ulong)((int)uVar30 + (uint)bVar49 + (uint)pMVar22->nCell +
                          (uint)pMVar22->nOverflow)) {
        lVar47 = lVar47 + 1;
        ppMVar34 = ppMVar26;
        if (lVar47 < (long)puVar35) {
          ppMVar34 = ppMVar29;
        }
        pMVar22 = *ppMVar34;
        lVar24 = lVar24 + 0x100000000;
        ppMVar26 = ppMVar26 + 1;
        ppMVar29 = ppMVar29 + 1;
      }
      iVar39 = iVar18;
      if (uVar33 == local_1f4[(long)iVar18 + -1]) {
        iVar39 = iVar18 + 1;
        local_238 = local_140[iVar18];
        iVar18 = iVar39;
        if ((uint)local_278 != 0) goto LAB_00174fcb;
      }
      else {
LAB_00174fcb:
        if (((((int)uVar32 <= (int)lVar47) ||
             (local_238->pgno != *(Pgno *)((long)aPgno + (lVar24 >> 0x1e)))) ||
            (pMVar25 < (MemPage *)pMVar22->aData)) ||
           (iVar18 = iVar39, (MemPage *)pMVar22->aDataEnd <= pMVar25)) {
          local_248 = (u16 *)CONCAT44(local_248._4_4_,iVar39);
          local_268 = pMVar25;
          if (bVar2 == 0) {
            uVar19 = sqlite3Get4byte(&pMVar25->isInit);
            ptrmapPut(local_220,uVar19,'\x05',local_238->pgno,&local_288);
          }
          uVar15 = cachedCellSize((CellArray *)&pChild,(int)uVar33);
          if (local_238->minLocal < uVar15) {
            ptrmapPutOvflPtr(local_238,pMVar22,&local_268->isInit,&local_288);
          }
          pMVar25 = local_270;
          pCur = local_280;
          iVar18 = local_288;
          if (local_288 != 0) goto LAB_0017486f;
          local_268 = (MemPage *)CONCAT44(local_268._4_4_,pChild._0_4_);
          puVar35 = local_230;
          iVar18 = (int)local_248;
        }
      }
      lVar24 = lVar47;
    }
    local_248 = puStack_f0;
  }
  pMVar22 = (MemPage *)0x0;
  local_238 = local_f8;
  iVar39 = 0;
  pMVar25 = local_270;
  do {
    if (pMVar22 == local_260) {
      uVar40 = -uVar32;
      local_114 = pgnoNew;
      local_10c = (uint)((uint)local_278 == 0);
      local_218 = pMStack_100;
      pMVar22 = pMStack_100;
      cVar14 = local_281;
      uVar37 = (uint)((uint)local_278 == 0);
      goto LAB_00175251;
    }
    pMVar28 = local_140[(long)((long)&pMVar22[-1].xParseCell + 7)];
    PVar31 = local_1f4[(long)((long)&pMVar22[-1].xParseCell + 7)];
    lVar24 = (long)(int)PVar31;
    pMVar48 = *(MemPage **)(local_238->aiOvfl + lVar24 * 4 + -0xe);
    uVar40 = (int)local_200 + (uint)local_248[lVar24];
    pMVar25 = (MemPage *)((long)&local_170->pPage + (long)iVar39);
    pMVar36 = pMVar25;
    if (pMVar28->leaf == '\0') {
      *(uint *)(pMVar28->aData + 8) = *(uint *)pMVar48;
    }
    else if ((uint)local_278 == 0) {
      pMVar48 = (MemPage *)((long)&pMVar48[-1].xParseCell + 4);
      if (local_248[lVar24] == 4) {
        local_240 = pMVar25;
        uVar15 = (*local_250->xCellSize)(local_250,(u8 *)pMVar48);
        uVar40 = (uint)uVar15;
        pMVar36 = local_240;
      }
    }
    else {
      PVar31 = PVar31 - 1;
      (*pMVar28->xParseCell)(pMVar28,*(u8 **)(local_238->aiOvfl + lVar24 * 4 + -0x12),&local_160);
      iVar18 = sqlite3PutVarint((uchar *)&pMVar25->pgno,local_160.nKey);
      uVar40 = iVar18 + 4;
      pMVar36 = (MemPage *)0x0;
      pMVar48 = pMVar25;
    }
    pMVar25 = local_270;
    uVar33 = 0;
    do {
      uVar30 = uVar33 + 1;
      if (5 < uVar33) break;
      pPVar1 = local_b8 + uVar33;
      uVar33 = uVar30;
    } while ((int)*pPVar1 <= (int)PVar31);
    if ((pMVar48 <= (MemPage *)(&puStack_f0)[uVar30]) &&
       ((MemPage *)(&puStack_f0)[uVar30] <
        (MemPage *)((long)pMVar48->aiOvfl + (long)(int)uVar40 + -0x1c))) {
      iVar18 = 0x12b11;
      goto LAB_001756bc;
    }
    iVar39 = iVar39 + uVar40;
    insertCell(local_250,(int)local_258 + (int)pMVar22,&pMVar48->isInit,uVar40,&pMVar36->isInit,
               pMVar28->pgno,&local_288);
    pMVar22 = (MemPage *)&pMVar22->intKey;
    puVar35 = local_230;
    pCur = local_280;
    iVar18 = local_288;
  } while (local_288 == 0);
LAB_0017486f:
  local_288 = iVar18;
  sqlite3DbFree((sqlite3 *)0x0,local_f8);
  for (pMVar22 = (MemPage *)0x0; pMVar25 != pMVar22; pMVar22 = (MemPage *)&pMVar22->intKey) {
    releasePage(apOld[(long)pMVar22]);
  }
  if ((int)uVar27 < 1) {
    uVar27 = 0;
  }
  for (uVar42 = 0; iVar18 = local_288, uVar27 != uVar42; uVar42 = uVar42 + 1) {
    releasePage(local_140[uVar42 - 1]);
  }
LAB_001748c8:
  if (local_168 != (DbPage *)0x0) {
    pcache1Free(local_168);
  }
  local_168 = local_170;
LAB_001748ea:
  pPage->nOverflow = '\0';
  releasePage(pPage);
  cVar14 = pCur->iPage + -1;
  pCur->iPage = cVar14;
  pMVar22 = pCur->apPage[cVar14];
LAB_0017490c:
  pCur->pPage = pMVar22;
  pPage = pMVar22;
  if (iVar18 != 0) {
LAB_001757f9:
    if (local_168 != (DbPage *)0x0) {
      pcache1Free(local_168);
    }
    return iVar18;
  }
  goto LAB_00173b9c;
LAB_00175251:
  uVar40 = uVar40 + 1;
  if ((int)uVar32 <= (int)uVar40) goto LAB_001756ca;
  uVar10 = -uVar40;
  if (0 < (int)uVar40) {
    uVar10 = uVar40;
  }
  if (abDone[uVar10] == '\0') {
    if ((int)uVar40 < 0) {
      if ((&iStack_9c)[(int)uVar10] < *(int *)((long)&local_200 + (long)(int)uVar10 * 4 + 4))
      goto LAB_00175251;
LAB_001752a2:
      if (uVar44 < uVar10) {
        uVar33 = (ulong)(uVar10 - 1);
        iVar18 = (Pgno)local_268;
      }
      else {
        uVar33 = (ulong)(int)(uVar10 - 1);
        iVar18 = *(int *)(&szCell + uVar33 * 2) + uVar37;
      }
      local_258 = (ulong)(local_1f4[uVar33 - 1] + uVar37);
      uVar37 = local_1f4[(ulong)uVar10 - 1] - (local_1f4[uVar33 - 1] + uVar37);
    }
    else {
      if (uVar40 != 0) goto LAB_001752a2;
      local_258 = 0;
      iVar18 = 0;
      uVar37 = local_114;
    }
    local_278 = (ulong)uVar37;
    pMVar28 = local_140[(ulong)uVar10 - 1];
    local_208 = (u16 *)pMVar28->aData;
    local_180 = (uint *)(ulong)pMVar28->hdrOffset;
    local_240 = (MemPage *)(pMVar28->aCellIdx + (int)(uVar37 * 2));
    uVar17 = pMVar28->nCell;
    iVar39 = (int)local_258;
    local_120 = (ulong)(uint)(iVar18 - iVar39);
    local_210 = (MemPage *)CONCAT44(local_210._4_4_,iVar18);
    uVar33 = (ulong)uVar17;
    uVar37 = (uint)pMVar28->nOverflow;
    local_260 = pMVar28;
    if (iVar18 < iVar39) {
      local_110 = (uint)pMVar28->nOverflow;
      iVar18 = pageFreeArray(pMVar28,iVar18,iVar39 - iVar18,(CellArray *)&pChild);
      local_200 = (ulong)((uint)uVar17 - iVar18);
      if (iVar18 <= (int)(uint)uVar17) {
        memmove(pMVar28->aCellIdx,pMVar28->aCellIdx + iVar18 * 2,
                (ulong)((uint)uVar17 + (uint)uVar17));
        uVar33 = local_200;
        uVar37 = local_110;
        iVar18 = (Pgno)local_210;
        goto LAB_001753aa;
      }
      iVar18 = 0x1274a;
LAB_001756bc:
      iVar18 = sqlite3CorruptError(iVar18);
      pCur = local_280;
      uVar27 = uVar32;
      goto LAB_0017486f;
    }
LAB_001753aa:
    iVar20 = (uint)uVar17 + iVar18 + uVar37;
    iVar39 = (int)local_278 + (int)local_258;
    iVar45 = iVar20 - iVar39;
    if (iVar45 != 0 && iVar39 <= iVar20) {
      iVar18 = pageFreeArray(local_260,iVar39,iVar45,(CellArray *)&pChild);
      uVar33 = (ulong)(uint)((int)uVar33 - iVar18);
      iVar18 = (Pgno)local_210;
    }
    local_160.nKey =
         (long)local_208 +
         (ulong)((ushort)(*(ushort *)((u8 *)((long)local_208 + 5) + (long)local_180) << 8 |
                         *(ushort *)((u8 *)((long)local_208 + 5) + (long)local_180) >> 8) - 1 &
                0xffff) + 1;
    if (((ulong)local_160.nKey < local_240) ||
       ((MemPage *)local_260->aDataEnd < (ulong)local_160.nKey)) {
LAB_001755e4:
      lVar24 = (long)(int)local_258 * 2;
      uVar33 = local_278;
      for (uVar30 = local_278 & 0xffffffff; pMVar28 = local_260, 0 < (int)uVar30;
          uVar30 = (ulong)((int)uVar30 - 1)) {
        if (*(short *)((long)local_248 + lVar24) == 0) {
          uVar15 = (*pMVar22->xCellSize)(pMVar22,*(u8 **)(local_238->aiOvfl + lVar24 * 2 + -0xe));
          *(u16 *)((long)local_248 + lVar24) = uVar15;
          uVar33 = local_278;
        }
        lVar24 = lVar24 + 2;
      }
      iVar18 = rebuildPage((CellArray *)&pChild,(int)local_258,(int)uVar33,local_260);
      pCur = local_280;
      if (iVar18 != 0) goto LAB_0017486f;
    }
    else {
      pMVar28 = local_260;
      if ((int)local_258 < iVar18) {
        uVar30 = local_120;
        if ((int)local_278 <= (int)local_120) {
          uVar30 = local_278;
        }
        puVar46 = local_260->aCellIdx;
        local_200 = uVar33;
        memmove(puVar46 + (int)uVar30 * 2,puVar46,(long)((int)uVar33 * 2));
        pMVar28 = local_260;
        local_120 = uVar30 & 0xffffffff;
        iVar18 = pageInsertArray(local_260,&local_240->isInit,(u8 **)&local_160,puVar46,
                                 (int)local_258,(int)uVar30,(CellArray *)&pChild);
        if (iVar18 != 0) goto LAB_001755e4;
        uVar33 = (ulong)(uint)((int)local_200 + (int)local_120);
        iVar18 = (Pgno)local_210;
      }
      uVar43 = 0;
      uVar30 = local_278;
      while( true ) {
        iVar39 = (int)uVar33;
        if (pMVar28->nOverflow <= uVar43) break;
        iVar45 = (uint)pMVar28->aiOvfl[uVar43] + iVar18;
        iVar20 = iVar45 - (int)local_258;
        if ((-1 < iVar20) && (iVar20 < (int)uVar30)) {
          puVar46 = pMVar28->aCellIdx + (uint)(iVar20 * 2);
          local_200 = uVar33;
          if (iVar39 - iVar20 != 0 && iVar20 <= iVar39) {
            memmove(puVar46 + 2,puVar46,(long)((iVar39 - iVar20) * 2));
          }
          cachedCellSize((CellArray *)&pChild,iVar45);
          pMVar28 = local_260;
          iVar18 = pageInsertArray(local_260,&local_240->isInit,(u8 **)&local_160,puVar46,iVar45,1,
                                   (CellArray *)&pChild);
          pMVar22 = local_218;
          pMVar25 = local_270;
          if (iVar18 != 0) goto LAB_001755e4;
          uVar33 = (ulong)((int)local_200 + 1);
          uVar30 = local_278;
          iVar18 = (Pgno)local_210;
        }
        uVar43 = uVar43 + 1;
      }
      iVar18 = pageInsertArray(pMVar28,&local_240->isInit,(u8 **)&local_160,
                               pMVar28->aCellIdx + iVar39 * 2,iVar39 + (int)local_258,
                               (int)uVar30 - iVar39,(CellArray *)&pChild);
      pMVar22 = local_218;
      if (iVar18 != 0) goto LAB_001755e4;
      pMVar28->nCell = (u16)local_278;
      pMVar28->nOverflow = '\0';
      ((u8 *)((long)local_208 + 3))[(long)local_180] = (u8)(local_278 >> 8);
      *(u8 *)((long)(local_208 + 2) + (long)local_180) = (u8)pMVar28->nCell;
      uVar17 = (short)local_160.nKey - (short)local_208;
      *(ushort *)((u8 *)((long)local_208 + 5) + (long)local_180) = uVar17 * 0x100 | uVar17 >> 8;
    }
    abDone[uVar10] = '\x01';
    pMVar28->nFree = (Pgno)local_228 - szNew[uVar10];
    puVar35 = local_230;
    cVar14 = local_281;
    uVar37 = local_10c;
  }
  goto LAB_00175251;
LAB_001756ca:
  local_288 = 0;
  if (((cVar14 == '\x01') && (local_250->nCell == 0)) &&
     (pMVar22 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew),
     (int)(uint)local_250->hdrOffset <= pMVar22->nFree)) {
    local_288 = defragmentPage(pMVar22,-1);
    copyNodeContent(pMVar22,local_250,&local_288);
    freePage(pMVar22,&local_288);
    puVar35 = local_230;
    pCur = local_280;
  }
  else {
    pCur = local_280;
    if (bVar2 == 0 && local_220->autoVacuum != '\0') {
      for (uVar33 = 0; uVar42 != uVar33; uVar33 = uVar33 + 1) {
        pMVar22 = local_140[uVar33 - 1];
        uVar19 = sqlite3Get4byte(pMVar22->aData + 8);
        pCur = local_280;
        ptrmapPut(local_220,uVar19,'\x05',pMVar22->pgno,&local_288);
        puVar35 = local_230;
      }
    }
  }
  for (; iVar18 = local_288, (long)puVar35 <= (long)local_178; puVar35 = (u16 *)((long)puVar35 + 1))
  {
    freePage(apOld[(long)puVar35],&local_288);
  }
  goto LAB_0017486f;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( sqlite3PagerPageRefcount(pPage->pDbPage)>1 ){
      /* The page being written is not a root page, and there is currently
      ** more than one reference to it. This only happens if the page is one
      ** of its own ancestor pages. Corruption. */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}